

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  vfloat<4> vVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  size_t sVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar14;
  ulong extraout_RDX;
  long lVar15;
  NodeRef *pNVar16;
  int iVar17;
  ulong uVar18;
  size_t in_R9;
  ulong uVar19;
  size_t sVar20;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  bool bVar22;
  vfloat_impl<4> __tmp;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar29;
  float fVar30;
  float fVar36;
  float fVar37;
  vint4 ai;
  float fVar38;
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  vint4 ai_1;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vint4 ai_3;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar56;
  float fVar57;
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar62;
  float fVar63;
  vint4 bi_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  float fVar65;
  float fVar68;
  float fVar69;
  vint4 bi_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  uint uVar71;
  uint uVar74;
  uint uVar75;
  vint4 ai_2;
  undefined1 auVar72 [16];
  uint uVar76;
  undefined1 auVar73 [16];
  uint uVar77;
  uint uVar78;
  uint uVar79;
  vint4 bi_2;
  uint uVar80;
  undefined1 in_XMM12 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM13 [16];
  undefined1 in_XMM14 [16];
  vint<4> octant;
  Precalculations pre;
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  vbool<4> valid_leaf;
  undefined1 local_1768 [16];
  RayQueryContext *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar55._8_4_ = 0xffffffff;
    auVar55._0_8_ = 0xffffffffffffffff;
    auVar55._12_4_ = 0xffffffff;
    auVar40._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar40._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar40._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar40._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    iVar17 = movmskps((int)This,auVar40);
    uVar18 = CONCAT44((int)((ulong)This >> 0x20),iVar17);
    if (iVar17 != 0) {
      local_1708 = *(float *)ray;
      fStack_1704 = *(float *)(ray + 4);
      fStack_1700 = *(float *)(ray + 8);
      fStack_16fc = *(float *)(ray + 0xc);
      auVar54 = *(undefined1 (*) [16])(ray + 0x40);
      fVar44 = (float)DAT_01ff1d40;
      fVar46 = DAT_01ff1d40._4_4_;
      fVar48 = DAT_01ff1d40._8_4_;
      fVar50 = DAT_01ff1d40._12_4_;
      auVar72._4_4_ = -(uint)(ABS(auVar54._4_4_) < fVar46);
      auVar72._0_4_ = -(uint)(ABS(auVar54._0_4_) < fVar44);
      auVar72._8_4_ = -(uint)(ABS(auVar54._8_4_) < fVar48);
      auVar72._12_4_ = -(uint)(ABS(auVar54._12_4_) < fVar50);
      auVar60 = blendvps(auVar54,_DAT_01ff1d40,auVar72);
      auVar72 = *(undefined1 (*) [16])(ray + 0x50);
      auVar66._4_4_ = -(uint)(ABS(auVar72._4_4_) < fVar46);
      auVar66._0_4_ = -(uint)(ABS(auVar72._0_4_) < fVar44);
      auVar66._8_4_ = -(uint)(ABS(auVar72._8_4_) < fVar48);
      auVar66._12_4_ = -(uint)(ABS(auVar72._12_4_) < fVar50);
      auVar66 = blendvps(auVar72,_DAT_01ff1d40,auVar66);
      auVar72 = *(undefined1 (*) [16])(ray + 0x60);
      auVar81._4_4_ = -(uint)(ABS(auVar72._4_4_) < fVar46);
      auVar81._0_4_ = -(uint)(ABS(auVar72._0_4_) < fVar44);
      auVar81._8_4_ = -(uint)(ABS(auVar72._8_4_) < fVar48);
      auVar81._12_4_ = -(uint)(ABS(auVar72._12_4_) < fVar50);
      auVar72 = blendvps(auVar72,_DAT_01ff1d40,auVar81);
      auVar81 = rcpps(in_XMM12,auVar60);
      local_1718 = auVar81._0_4_;
      fStack_1714 = auVar81._4_4_;
      fStack_1710 = auVar81._8_4_;
      fStack_170c = auVar81._12_4_;
      auVar81 = rcpps(in_XMM13,auVar66);
      local_1728 = auVar81._0_4_;
      fStack_1724 = auVar81._4_4_;
      fStack_1720 = auVar81._8_4_;
      fStack_171c = auVar81._12_4_;
      auVar81 = rcpps(in_XMM14,auVar72);
      local_1738 = auVar81._0_4_;
      fStack_1734 = auVar81._4_4_;
      fStack_1730 = auVar81._8_4_;
      fStack_172c = auVar81._12_4_;
      auVar53._0_8_ =
           CONCAT44(-(uint)(auVar54._4_4_ < 0.0),-(uint)(auVar54._0_4_ < 0.0)) & 0x100000001;
      auVar53._8_4_ = -(uint)(auVar54._8_4_ < 0.0) & 1;
      auVar53._12_4_ = -(uint)(auVar54._12_4_ < 0.0) & 1;
      auVar67._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
           0x200000002;
      auVar67._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
      auVar67._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
      local_1748 = *(float *)(ray + 0x10);
      fStack_1744 = *(float *)(ray + 0x14);
      fStack_1740 = *(float *)(ray + 0x18);
      fStack_173c = *(float *)(ray + 0x1c);
      local_16e8 = *(undefined8 *)(ray + 0x20);
      uStack_16e0 = *(undefined8 *)(ray + 0x28);
      auVar54._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
           0x400000004;
      auVar54._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
      auVar54._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
      local_1768 = auVar40 ^ auVar55 | auVar54 | auVar67 | auVar53;
      do {
        lVar15 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        iVar17 = *(int *)(local_1768 + lVar15 * 4);
        auVar61._0_4_ = -(uint)(iVar17 == local_1768._0_4_);
        auVar61._4_4_ = -(uint)(iVar17 == local_1768._4_4_);
        auVar61._8_4_ = -(uint)(iVar17 == local_1768._8_4_);
        auVar61._12_4_ = -(uint)(iVar17 == local_1768._12_4_);
        uVar12 = movmskps((int)lVar15,auVar61);
        uVar14 = ~CONCAT44((int)((ulong)lVar15 >> 0x20),uVar12);
        uVar18 = uVar18 & uVar14;
      } while (uVar18 != 0);
      auVar28._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
      auVar28._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
      auVar28._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
      auVar28._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
      local_1718 = local_1718 + (1.0 - auVar60._0_4_ * local_1718) * local_1718;
      fStack_1714 = fStack_1714 + (1.0 - auVar60._4_4_ * fStack_1714) * fStack_1714;
      fStack_1710 = fStack_1710 + (1.0 - auVar60._8_4_ * fStack_1710) * fStack_1710;
      fStack_170c = fStack_170c + (1.0 - auVar60._12_4_ * fStack_170c) * fStack_170c;
      local_1728 = local_1728 + (1.0 - auVar66._0_4_ * local_1728) * local_1728;
      fStack_1724 = fStack_1724 + (1.0 - auVar66._4_4_ * fStack_1724) * fStack_1724;
      fStack_1720 = fStack_1720 + (1.0 - auVar66._8_4_ * fStack_1720) * fStack_1720;
      fStack_171c = fStack_171c + (1.0 - auVar66._12_4_ * fStack_171c) * fStack_171c;
      local_1738 = local_1738 + (1.0 - auVar72._0_4_ * local_1738) * local_1738;
      fStack_1734 = fStack_1734 + (1.0 - auVar72._4_4_ * fStack_1734) * fStack_1734;
      fStack_1730 = fStack_1730 + (1.0 - auVar72._8_4_ * fStack_1730) * fStack_1730;
      fStack_172c = fStack_172c + (1.0 - auVar72._12_4_ * fStack_172c) * fStack_172c;
      auVar40 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar55 = maxps(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0));
      local_16f8.v = (__m128)blendvps(_DAT_01feb9f0,auVar40,auVar28);
      _local_1788 = blendvps(_DAT_01feba00,auVar55,auVar28);
      pNVar16 = stack_node + 2;
      paVar21 = &stack_near[2].field_0;
      local_1768 = auVar28 | local_1768;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar11 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_node[1].ptr = sVar11;
      stack_near[1].field_0 = local_16f8;
      local_1750 = context;
      do {
        paVar21 = paVar21 + -1;
        sVar20 = pNVar16[-1].ptr;
        pNVar16 = pNVar16 + -1;
        sVar11 = CONCAT71((int7)(sVar11 >> 8),1);
        if (sVar20 != 0xfffffffffffffff8) {
          aVar32.v = *(__m128 *)paVar21->v;
          auVar60._4_4_ = -(uint)(aVar32.v[1] < (float)local_1788._4_4_);
          auVar60._0_4_ = -(uint)(aVar32.v[0] < (float)local_1788._0_4_);
          auVar60._8_4_ = -(uint)(aVar32.v[2] < fStack_1780);
          auVar60._12_4_ = -(uint)(aVar32.v[3] < fStack_177c);
          uVar13 = movmskps((int)uVar14,auVar60);
          uVar14 = (ulong)uVar13;
          if (uVar13 != 0) {
            do {
              fVar44 = aVar32.v[0];
              fVar46 = aVar32.v[1];
              fVar48 = aVar32.v[2];
              fVar50 = aVar32.v[3];
              uVar13 = (uint)sVar20;
              if ((sVar20 & 8) != 0) {
                if (sVar20 == 0xfffffffffffffff8) goto LAB_0025a191;
                valid_leaf.field_0.i[1] = -(uint)(fVar46 < (float)local_1788._4_4_);
                valid_leaf.field_0.i[0] = -(uint)(fVar44 < (float)local_1788._0_4_);
                valid_leaf.field_0.i[2] = -(uint)(fVar48 < fStack_1780);
                valid_leaf.field_0.i[3] = -(uint)(fVar50 < fStack_177c);
                iVar17 = movmskps((int)sVar11,(undefined1  [16])valid_leaf.field_0);
                if (iVar17 != 0) {
                  lVar15 = (ulong)(uVar13 & 0xf) - 8;
                  if (lVar15 != 0) {
                    prim = (Primitive_conflict4 *)(sVar20 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorKMB<4>::intersect
                                (&valid_leaf,&pre,ray,local_1750,prim);
                      prim = prim + 1;
                      lVar15 = lVar15 + -1;
                      uVar14 = extraout_RDX;
                    } while (lVar15 != 0);
                  }
                  _local_1788 = blendvps(_local_1788,*(undefined1 (*) [16])(ray + 0x80),
                                         (undefined1  [16])valid_leaf.field_0);
                }
                break;
              }
              uVar14 = sVar20 & 0xfffffffffffffff0;
              uVar19 = 0;
              uVar18 = 0;
              sVar20 = 8;
              aVar29 = _DAT_01feb9f0;
              do {
                sVar3 = *(size_t *)(uVar14 + uVar18 * 8);
                aVar32 = aVar29;
                if (sVar3 != 8) {
                  fVar38 = *(float *)(uVar14 + 0x80 + uVar18 * 4);
                  fVar39 = *(float *)(uVar14 + 0x20 + uVar18 * 4);
                  fVar58 = *(float *)(uVar14 + 0x30 + uVar18 * 4);
                  fVar43 = *(float *)(uVar14 + 0x40 + uVar18 * 4);
                  fVar59 = *(float *)(uVar14 + 0x50 + uVar18 * 4);
                  fVar7 = *(float *)(ray + 0x70);
                  fVar8 = *(float *)(ray + 0x74);
                  fVar9 = *(float *)(ray + 0x78);
                  fVar10 = *(float *)(ray + 0x7c);
                  fVar45 = *(float *)(uVar14 + 0xa0 + uVar18 * 4);
                  fVar51 = *(float *)(uVar14 + 0xc0 + uVar18 * 4);
                  fVar52 = *(float *)(uVar14 + 0x60 + uVar18 * 4);
                  fVar62 = *(float *)(uVar14 + 0x90 + uVar18 * 4);
                  fVar63 = *(float *)(uVar14 + 0xb0 + uVar18 * 4);
                  fVar64 = *(float *)(uVar14 + 0xd0 + uVar18 * 4);
                  fVar1 = *(float *)(uVar14 + 0x70 + uVar18 * 4);
                  fVar30 = ((fVar38 * fVar7 + fVar39) - local_1708) * local_1718;
                  fVar36 = ((fVar38 * fVar8 + fVar39) - fStack_1704) * fStack_1714;
                  fVar37 = ((fVar38 * fVar9 + fVar39) - fStack_1700) * fStack_1710;
                  fVar38 = ((fVar38 * fVar10 + fVar39) - fStack_16fc) * fStack_170c;
                  fVar39 = ((fVar45 * fVar7 + fVar43) - local_1748) * local_1728;
                  fVar41 = ((fVar45 * fVar8 + fVar43) - fStack_1744) * fStack_1724;
                  fVar42 = ((fVar45 * fVar9 + fVar43) - fStack_1740) * fStack_1720;
                  fVar43 = ((fVar45 * fVar10 + fVar43) - fStack_173c) * fStack_171c;
                  fVar45 = ((fVar51 * fVar7 + fVar52) - (float)local_16e8) * local_1738;
                  fVar47 = ((fVar51 * fVar8 + fVar52) - local_16e8._4_4_) * fStack_1734;
                  fVar49 = ((fVar51 * fVar9 + fVar52) - (float)uStack_16e0) * fStack_1730;
                  fVar51 = ((fVar51 * fVar10 + fVar52) - uStack_16e0._4_4_) * fStack_172c;
                  fVar52 = ((fVar62 * fVar7 + fVar58) - local_1708) * local_1718;
                  fVar56 = ((fVar62 * fVar8 + fVar58) - fStack_1704) * fStack_1714;
                  fVar57 = ((fVar62 * fVar9 + fVar58) - fStack_1700) * fStack_1710;
                  fVar58 = ((fVar62 * fVar10 + fVar58) - fStack_16fc) * fStack_170c;
                  fVar65 = ((fVar63 * fVar7 + fVar59) - local_1748) * local_1728;
                  fVar68 = ((fVar63 * fVar8 + fVar59) - fStack_1744) * fStack_1724;
                  fVar69 = ((fVar63 * fVar9 + fVar59) - fStack_1740) * fStack_1720;
                  fVar70 = ((fVar63 * fVar10 + fVar59) - fStack_173c) * fStack_171c;
                  fVar59 = ((fVar64 * fVar7 + fVar1) - (float)local_16e8) * local_1738;
                  fVar62 = ((fVar64 * fVar8 + fVar1) - local_16e8._4_4_) * fStack_1734;
                  fVar63 = ((fVar64 * fVar9 + fVar1) - (float)uStack_16e0) * fStack_1730;
                  fVar64 = ((fVar64 * fVar10 + fVar1) - uStack_16e0._4_4_) * fStack_172c;
                  uVar71 = (uint)((int)fVar52 < (int)fVar30) * (int)fVar52 |
                           (uint)((int)fVar52 >= (int)fVar30) * (int)fVar30;
                  uVar74 = (uint)((int)fVar56 < (int)fVar36) * (int)fVar56 |
                           (uint)((int)fVar56 >= (int)fVar36) * (int)fVar36;
                  uVar75 = (uint)((int)fVar57 < (int)fVar37) * (int)fVar57 |
                           (uint)((int)fVar57 >= (int)fVar37) * (int)fVar37;
                  uVar76 = (uint)((int)fVar58 < (int)fVar38) * (int)fVar58 |
                           (uint)((int)fVar58 >= (int)fVar38) * (int)fVar38;
                  uVar77 = (uint)((int)fVar65 < (int)fVar39) * (int)fVar65 |
                           (uint)((int)fVar65 >= (int)fVar39) * (int)fVar39;
                  uVar78 = (uint)((int)fVar68 < (int)fVar41) * (int)fVar68 |
                           (uint)((int)fVar68 >= (int)fVar41) * (int)fVar41;
                  uVar79 = (uint)((int)fVar69 < (int)fVar42) * (int)fVar69 |
                           (uint)((int)fVar69 >= (int)fVar42) * (int)fVar42;
                  uVar80 = (uint)((int)fVar70 < (int)fVar43) * (int)fVar70 |
                           (uint)((int)fVar70 >= (int)fVar43) * (int)fVar43;
                  uVar77 = ((int)uVar77 < (int)uVar71) * uVar71 |
                           ((int)uVar77 >= (int)uVar71) * uVar77;
                  uVar78 = ((int)uVar78 < (int)uVar74) * uVar74 |
                           ((int)uVar78 >= (int)uVar74) * uVar78;
                  uVar79 = ((int)uVar79 < (int)uVar75) * uVar75 |
                           ((int)uVar79 >= (int)uVar75) * uVar79;
                  uVar80 = ((int)uVar80 < (int)uVar76) * uVar76 |
                           ((int)uVar80 >= (int)uVar76) * uVar80;
                  uVar71 = (uint)((int)fVar59 < (int)fVar45) * (int)fVar59 |
                           (uint)((int)fVar59 >= (int)fVar45) * (int)fVar45;
                  uVar74 = (uint)((int)fVar62 < (int)fVar47) * (int)fVar62 |
                           (uint)((int)fVar62 >= (int)fVar47) * (int)fVar47;
                  uVar75 = (uint)((int)fVar63 < (int)fVar49) * (int)fVar63 |
                           (uint)((int)fVar63 >= (int)fVar49) * (int)fVar49;
                  uVar76 = (uint)((int)fVar64 < (int)fVar51) * (int)fVar64 |
                           (uint)((int)fVar64 >= (int)fVar51) * (int)fVar51;
                  auVar73._0_4_ =
                       ((int)uVar71 < (int)uVar77) * uVar77 | ((int)uVar71 >= (int)uVar77) * uVar71;
                  auVar73._4_4_ =
                       ((int)uVar74 < (int)uVar78) * uVar78 | ((int)uVar74 >= (int)uVar78) * uVar74;
                  auVar73._8_4_ =
                       ((int)uVar75 < (int)uVar79) * uVar79 | ((int)uVar75 >= (int)uVar79) * uVar75;
                  auVar73._12_4_ =
                       ((int)uVar76 < (int)uVar80) * uVar80 | ((int)uVar76 >= (int)uVar80) * uVar76;
                  uVar71 = (uint)((int)fVar52 < (int)fVar30) * (int)fVar30 |
                           (uint)((int)fVar52 >= (int)fVar30) * (int)fVar52;
                  uVar74 = (uint)((int)fVar56 < (int)fVar36) * (int)fVar36 |
                           (uint)((int)fVar56 >= (int)fVar36) * (int)fVar56;
                  uVar75 = (uint)((int)fVar57 < (int)fVar37) * (int)fVar37 |
                           (uint)((int)fVar57 >= (int)fVar37) * (int)fVar57;
                  uVar76 = (uint)((int)fVar58 < (int)fVar38) * (int)fVar38 |
                           (uint)((int)fVar58 >= (int)fVar38) * (int)fVar58;
                  uVar77 = (uint)((int)fVar65 < (int)fVar39) * (int)fVar39 |
                           (uint)((int)fVar65 >= (int)fVar39) * (int)fVar65;
                  uVar78 = (uint)((int)fVar68 < (int)fVar41) * (int)fVar41 |
                           (uint)((int)fVar68 >= (int)fVar41) * (int)fVar68;
                  uVar79 = (uint)((int)fVar69 < (int)fVar42) * (int)fVar42 |
                           (uint)((int)fVar69 >= (int)fVar42) * (int)fVar69;
                  uVar80 = (uint)((int)fVar70 < (int)fVar43) * (int)fVar43 |
                           (uint)((int)fVar70 >= (int)fVar43) * (int)fVar70;
                  uVar77 = ((int)uVar71 < (int)uVar77) * uVar71 |
                           ((int)uVar71 >= (int)uVar77) * uVar77;
                  uVar78 = ((int)uVar74 < (int)uVar78) * uVar74 |
                           ((int)uVar74 >= (int)uVar78) * uVar78;
                  uVar79 = ((int)uVar75 < (int)uVar79) * uVar75 |
                           ((int)uVar75 >= (int)uVar79) * uVar79;
                  uVar80 = ((int)uVar76 < (int)uVar80) * uVar76 |
                           ((int)uVar76 >= (int)uVar80) * uVar80;
                  uVar71 = (uint)((int)fVar59 < (int)fVar45) * (int)fVar45 |
                           (uint)((int)fVar59 >= (int)fVar45) * (int)fVar59;
                  uVar74 = (uint)((int)fVar62 < (int)fVar47) * (int)fVar47 |
                           (uint)((int)fVar62 >= (int)fVar47) * (int)fVar62;
                  uVar75 = (uint)((int)fVar63 < (int)fVar49) * (int)fVar49 |
                           (uint)((int)fVar63 >= (int)fVar49) * (int)fVar63;
                  uVar76 = (uint)((int)fVar64 < (int)fVar51) * (int)fVar51 |
                           (uint)((int)fVar64 >= (int)fVar51) * (int)fVar64;
                  uVar71 = (uint)((int)local_1788._0_4_ < (int)uVar71) * local_1788._0_4_ |
                           ((int)local_1788._0_4_ >= (int)uVar71) * uVar71;
                  uVar74 = (uint)((int)local_1788._4_4_ < (int)uVar74) * local_1788._4_4_ |
                           ((int)local_1788._4_4_ >= (int)uVar74) * uVar74;
                  uVar75 = (uint)((int)fStack_1780 < (int)uVar75) * (int)fStack_1780 |
                           ((int)fStack_1780 >= (int)uVar75) * uVar75;
                  uVar76 = (uint)((int)fStack_177c < (int)uVar76) * (int)fStack_177c |
                           ((int)fStack_177c >= (int)uVar76) * uVar76;
                  bVar22 = (float)((uint)((int)auVar73._0_4_ < (int)local_16f8._0_4_) *
                                   local_16f8._0_4_ |
                                  ((int)auVar73._0_4_ >= (int)local_16f8._0_4_) * auVar73._0_4_) <=
                           (float)(((int)uVar77 < (int)uVar71) * uVar77 |
                                  ((int)uVar77 >= (int)uVar71) * uVar71);
                  bVar4 = (float)((uint)((int)auVar73._4_4_ < (int)local_16f8._4_4_) *
                                  local_16f8._4_4_ |
                                 ((int)auVar73._4_4_ >= (int)local_16f8._4_4_) * auVar73._4_4_) <=
                          (float)(((int)uVar78 < (int)uVar74) * uVar78 |
                                 ((int)uVar78 >= (int)uVar74) * uVar74);
                  bVar5 = (float)((uint)((int)auVar73._8_4_ < (int)local_16f8._8_4_) *
                                  local_16f8._8_4_ |
                                 ((int)auVar73._8_4_ >= (int)local_16f8._8_4_) * auVar73._8_4_) <=
                          (float)(((int)uVar79 < (int)uVar75) * uVar79 |
                                 ((int)uVar79 >= (int)uVar75) * uVar75);
                  bVar6 = (float)((uint)((int)auVar73._12_4_ < (int)local_16f8._12_4_) *
                                  local_16f8._12_4_ |
                                 ((int)auVar73._12_4_ >= (int)local_16f8._12_4_) * auVar73._12_4_)
                          <= (float)(((int)uVar80 < (int)uVar76) * uVar80 |
                                    ((int)uVar80 >= (int)uVar76) * uVar76);
                  auVar31._4_4_ = -(uint)bVar4;
                  auVar31._0_4_ = -(uint)bVar22;
                  auVar31._8_4_ = -(uint)bVar5;
                  auVar31._12_4_ = -(uint)bVar6;
                  if ((uVar13 & 7) == 6) {
                    fVar38 = *(float *)(uVar14 + 0xe0 + uVar18 * 4);
                    fVar39 = *(float *)(uVar14 + 0xf0 + uVar18 * 4);
                    auVar31._0_4_ = -(uint)((fVar7 < fVar39 && fVar38 <= fVar7) && bVar22);
                    auVar31._4_4_ = -(uint)((fVar8 < fVar39 && fVar38 <= fVar8) && bVar4);
                    auVar31._8_4_ = -(uint)((fVar9 < fVar39 && fVar38 <= fVar9) && bVar5);
                    auVar31._12_4_ = -(uint)((fVar10 < fVar39 && fVar38 <= fVar10) && bVar6);
                  }
                  auVar23._0_4_ =
                       (-(uint)(fVar44 < (float)local_1788._0_4_) & auVar31._0_4_) << 0x1f;
                  auVar23._4_4_ =
                       (-(uint)(fVar46 < (float)local_1788._4_4_) & auVar31._4_4_) << 0x1f;
                  auVar23._8_4_ = (-(uint)(fVar48 < fStack_1780) & auVar31._8_4_) << 0x1f;
                  auVar23._12_4_ = (-(uint)(fVar50 < fStack_177c) & auVar31._12_4_) << 0x1f;
                  uVar71 = movmskps((int)in_R9,auVar23);
                  in_R9 = (ulong)uVar71;
                  if (uVar71 != 0) {
                    aVar32.v = (__m128)blendvps(_DAT_01feb9f0,auVar73,auVar23);
                    auVar24._4_4_ = -(uint)(aVar32.v[1] < aVar29.v[1]);
                    auVar24._0_4_ = -(uint)(aVar32.v[0] < aVar29.v[0]);
                    auVar24._8_4_ = -(uint)(aVar32.v[2] < aVar29.v[2]);
                    auVar24._12_4_ = -(uint)(aVar32.v[3] < aVar29.v[3]);
                    iVar17 = movmskps(uVar71,auVar24);
                    in_R9 = sVar3;
                    aVar25 = aVar32;
                    if ((iVar17 == 0) ||
                       (bVar22 = sVar20 != 8, in_R9 = sVar20, sVar20 = sVar3, aVar25 = aVar29,
                       aVar29 = aVar32, bVar22)) {
                      aVar32 = aVar29;
                      uVar19 = uVar19 + 1;
                      pNVar16->ptr = in_R9;
                      pNVar16 = pNVar16 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar25;
                      paVar21 = paVar21 + 1;
                    }
                  }
                }
              } while ((sVar3 != 8) &&
                      (bVar22 = uVar18 < 3, uVar18 = uVar18 + 1, aVar29 = aVar32, bVar22));
              uVar14 = CONCAT71((int7)(uVar14 >> 8),sVar20 != 8);
              if (1 < uVar19 && sVar20 != 8) {
                vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21[-2].v;
                auVar33._4_4_ = -(uint)(vVar2.field_0._4_4_ < *(float *)((long)paVar21 + -0xc));
                auVar33._0_4_ = -(uint)(vVar2.field_0._0_4_ < paVar21[-1].v[0]);
                auVar33._8_4_ = -(uint)(vVar2.field_0._8_4_ < *(float *)((long)paVar21 + -8));
                auVar33._12_4_ = -(uint)(vVar2.field_0._12_4_ < *(float *)((long)paVar21 + -4));
                uVar13 = movmskps((int)uVar14,auVar33);
                uVar14 = (ulong)uVar13;
                if (uVar13 != 0) {
                  paVar21[-2].v[0] = paVar21[-1].v[0];
                  *(float *)((long)paVar21 + -0x1c) = *(float *)((long)paVar21 + -0xc);
                  *(float *)((long)paVar21 + -0x18) = *(float *)((long)paVar21 + -8);
                  *(float *)((long)paVar21 + -0x14) = *(float *)((long)paVar21 + -4);
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21[-1].v = vVar2.field_0;
                  auVar40 = *(undefined1 (*) [16])(pNVar16 + -2);
                  auVar26._0_8_ = auVar40._8_8_;
                  auVar26._8_4_ = auVar40._0_4_;
                  auVar26._12_4_ = auVar40._4_4_;
                  *(undefined1 (*) [16])(pNVar16 + -2) = auVar26;
                }
                if (uVar19 != 2) {
                  fVar44 = paVar21[-3].v[0];
                  fVar46 = *(float *)((long)paVar21 + -0x2c);
                  fVar48 = *(float *)((long)paVar21 + -0x28);
                  fVar50 = *(float *)((long)paVar21 + -0x24);
                  auVar34._4_4_ = -(uint)(fVar46 < *(float *)((long)paVar21 + -0xc));
                  auVar34._0_4_ = -(uint)(fVar44 < paVar21[-1].v[0]);
                  auVar34._8_4_ = -(uint)(fVar48 < *(float *)((long)paVar21 + -8));
                  auVar34._12_4_ = -(uint)(fVar50 < *(float *)((long)paVar21 + -4));
                  uVar13 = movmskps(uVar13,auVar34);
                  uVar18 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    paVar21[-3].v[0] = paVar21[-1].v[0];
                    *(float *)((long)paVar21 + -0x2c) = *(float *)((long)paVar21 + -0xc);
                    *(float *)((long)paVar21 + -0x28) = *(float *)((long)paVar21 + -8);
                    *(float *)((long)paVar21 + -0x24) = *(float *)((long)paVar21 + -4);
                    paVar21[-1].v[0] = fVar44;
                    *(float *)((long)paVar21 + -0xc) = fVar46;
                    *(float *)((long)paVar21 + -8) = fVar48;
                    *(float *)((long)paVar21 + -4) = fVar50;
                    sVar3 = pNVar16[-3].ptr;
                    uVar18 = pNVar16[-1].ptr;
                    pNVar16[-3].ptr = uVar18;
                    pNVar16[-1].ptr = sVar3;
                  }
                  vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21[-3].v;
                  auVar35._4_4_ = -(uint)(vVar2.field_0._4_4_ < *(float *)((long)paVar21 + -0x1c));
                  auVar35._0_4_ = -(uint)(vVar2.field_0._0_4_ < paVar21[-2].v[0]);
                  auVar35._8_4_ = -(uint)(vVar2.field_0._8_4_ < *(float *)((long)paVar21 + -0x18));
                  auVar35._12_4_ = -(uint)(vVar2.field_0._12_4_ < *(float *)((long)paVar21 + -0x14))
                  ;
                  uVar13 = movmskps((int)uVar18,auVar35);
                  uVar14 = (ulong)uVar13;
                  if (uVar13 != 0) {
                    paVar21[-3].v[0] = paVar21[-2].v[0];
                    *(float *)((long)paVar21 + -0x2c) = *(float *)((long)paVar21 + -0x1c);
                    *(float *)((long)paVar21 + -0x28) = *(float *)((long)paVar21 + -0x18);
                    *(float *)((long)paVar21 + -0x24) = *(float *)((long)paVar21 + -0x14);
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21[-2].v = vVar2.field_0;
                    auVar40 = *(undefined1 (*) [16])(pNVar16 + -3);
                    auVar27._0_8_ = auVar40._8_8_;
                    auVar27._8_4_ = auVar40._0_4_;
                    auVar27._12_4_ = auVar40._4_4_;
                    *(undefined1 (*) [16])(pNVar16 + -3) = auVar27;
                  }
                }
              }
            } while (sVar20 != 8);
          }
          sVar11 = 0;
        }
LAB_0025a191:
      } while ((char)sVar11 == '\0');
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }